

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChessEngine.cpp
# Opt level: O0

uint64_t __thiscall senjo::ChessEngine::Perft(ChessEngine *this,int depth)

{
  int iVar1;
  undefined4 extraout_var;
  int depth_local;
  ChessEngine *this_local;
  
  _stop = _stop & 0xfffffffd;
  _searching = 0;
  _startTime = Now();
  _stopTime = 0;
  iVar1 = (*this->_vptr_ChessEngine[0x1c])(this,(ulong)(uint)depth);
  return CONCAT44(extraout_var,iVar1);
}

Assistant:

uint64_t ChessEngine::Perft(const int depth)
{
  _stop &= ~StopReason::Timeout;
  _searching = false;
  _startTime = Now();
  _stopTime = 0;
  return MyPerft(depth);
}